

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_streams_blocked
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_sentmap_t *pqVar1;
  quicly_maxsender_sent_t *sent_00;
  
  pqVar1 = map + 3;
  if ((sent->data).max_streams.uni != 0) {
    pqVar1 = map + 2;
  }
  sent_00 = &(sent->data).max_stream_data.args;
  if (acked == 0) {
    quicly_maxsender_lost((quicly_maxsender_t *)(pqVar1 + 1),sent_00);
  }
  else {
    quicly_maxsender_acked((quicly_maxsender_t *)(pqVar1 + 1),sent_00);
  }
  return 0;
}

Assistant:

static int on_ack_streams_blocked(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    struct st_quicly_max_streams_t *m =
        sent->data.streams_blocked.uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi;

    if (acked) {
        quicly_maxsender_acked(&m->blocked_sender, &sent->data.streams_blocked.args);
    } else {
        quicly_maxsender_lost(&m->blocked_sender, &sent->data.streams_blocked.args);
    }

    return 0;
}